

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O0

wal_item * wal_itr_last(wal_iterator *wal_itr)

{
  avl_node *paVar1;
  long in_RDI;
  avl_node *a;
  wal_iterator *in_stack_00000098;
  wal_item *local_28;
  wal_item *local_20;
  wal_item *local_8;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x33) & 1) == 0) {
    if (*(long *)(*(long *)(in_RDI + 8) + 0x20) == 0) {
      local_8 = (wal_item *)0x0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x22) = 2;
      if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
        local_8 = _wal_itr_last_byseq((wal_iterator *)0x120890);
      }
      else {
        local_8 = _wal_itr_last_bykey(in_stack_00000098);
      }
    }
  }
  else if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    paVar1 = avl_last((avl_tree *)(*(long *)(in_RDI + 8) + 0xd0));
    *(avl_node **)(in_RDI + 0x38) = paVar1;
    if (paVar1 == (avl_node *)0x0) {
      local_28 = (wal_item *)0x0;
    }
    else {
      local_28 = (wal_item *)&paVar1[-1].left;
    }
    local_8 = local_28;
  }
  else {
    paVar1 = avl_last((avl_tree *)(*(long *)(in_RDI + 8) + 0xc0));
    *(avl_node **)(in_RDI + 0x38) = paVar1;
    if (paVar1 == (avl_node *)0x0) {
      local_20 = (wal_item *)0x0;
    }
    else {
      local_20 = (wal_item *)&paVar1[-5].right;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

struct wal_item* wal_itr_last(struct wal_iterator *wal_itr) {
    if (wal_itr->shandle->is_persisted_snapshot) {
        struct avl_node *a;
        if (wal_itr->by_key) {
            a = avl_last(&wal_itr->shandle->key_tree);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_keysnap) : NULL;
        } else {
            a = avl_last(&wal_itr->shandle->seq_tree);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_seq) : NULL;
        }
    }

    if (wal_itr->shandle->snap_tag_idx) { // no items in WAL in snapshot..
        wal_itr->direction = FDB_ITR_REVERSE;
        if (wal_itr->by_key) {
            return _wal_itr_last_bykey(wal_itr);
        } else {
            return _wal_itr_last_byseq(wal_itr);
        }
    }
    return NULL;
}